

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O2

void __thiscall rr::Renderer::drawInstanced(Renderer *this,DrawCommand *command,int numInstances)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pFVar3;
  VertexPacket **ppVVar4;
  int *piVar5;
  int iVar6;
  VertexShader *pVVar7;
  pointer pVVar8;
  pointer pVVar9;
  GeometryShader *pGVar10;
  RenderState *pRVar11;
  VertexPacket *pVVar12;
  undefined8 uVar13;
  DrawContext DVar14;
  pointer pTVar15;
  pointer ppVVar16;
  bool bVar17;
  TextureChannelClass TVar18;
  uint uVar19;
  PrimitiveType PVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  Program *pPVar24;
  size_t ndx;
  pointer pFVar25;
  ulong uVar26;
  FragmentShader *pFVar27;
  size_t sVar28;
  PrimitiveList *this_00;
  GenericVecType GVar29;
  RenderTarget *pRVar30;
  size_t numberOfVertexOutputs;
  size_type sVar31;
  vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_> *__x;
  long lVar32;
  ulong uVar33;
  size_t varyingNdx_2;
  VertexPacketAllocator *pVVar34;
  ulong uVar35;
  int iVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  pointer pTVar40;
  ulong uVar41;
  DrawContext local_16c;
  vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_> inputPrimitives;
  vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_> primitives;
  _Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> local_128;
  VertexPacketAllocator *local_110;
  VertexPacketAllocator vpalloc_1;
  GeometryEmitter emitter;
  vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> vertexPackets;
  VertexPacketAllocator vpalloc;
  
  if (numInstances < 1) {
    return;
  }
  pPVar24 = command->program;
  __x = &pPVar24->vertexShader->m_outputs;
  local_110 = (VertexPacketAllocator *)command;
  if (pPVar24->geometryShader == (GeometryShader *)0x0) {
    bVar17 = std::operator!=(__x,&pPVar24->fragmentShader->m_inputs);
    if (bVar17) {
      return;
    }
  }
  else {
    bVar17 = std::operator!=(__x,(vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                  *)(pPVar24->geometryShader + 0x20));
    if (bVar17) {
      return;
    }
    pPVar24 = (Program *)
              (local_110->m_allocations).
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    bVar17 = std::operator!=((vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                              *)(pPVar24->geometryShader + 0x38),&pPVar24->fragmentShader->m_inputs)
    ;
    if (bVar17) {
      return;
    }
  }
  pPVar24 = (Program *)
            (local_110->m_allocations).
            super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pVVar7 = pPVar24->vertexShader;
  pVVar8 = (pVVar7->m_inputs).
           super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar23 = (long)(pVVar7->m_inputs).
                 super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pVVar8 >> 2;
  uVar41 = 0;
  while (uVar23 != uVar41) {
    pVVar1 = pVVar8 + uVar41;
    uVar41 = uVar41 + 1;
    if (GENERICVECTYPE_INT32 < pVVar1->type) {
      return;
    }
  }
  pVVar9 = (pVVar7->m_outputs).
           super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar37 = 0;
  while ((long)(pVVar7->m_outputs).
               super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)pVVar9 >> 3 != lVar37) {
    pVVar2 = pVVar9 + lVar37;
    lVar37 = lVar37 + 1;
    if (GENERICVECTYPE_INT32 < pVVar2->type) {
      return;
    }
  }
  pFVar27 = pPVar24->fragmentShader;
  pVVar9 = (pFVar27->m_inputs).
           super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar37 = 0;
  while ((long)(pFVar27->m_inputs).
               super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)pVVar9 >> 3 != lVar37) {
    pVVar2 = pVVar9 + lVar37;
    lVar37 = lVar37 + 1;
    if (GENERICVECTYPE_INT32 < pVVar2->type) {
      return;
    }
  }
  pFVar25 = (pFVar27->m_outputs).
            super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar26 = (long)(pFVar27->m_outputs).
                 super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar25 >> 2;
  uVar41 = 0;
  while (uVar26 != uVar41) {
    pFVar3 = pFVar25 + uVar41;
    uVar41 = uVar41 + 1;
    if (GENERICVECTYPE_INT32 < pFVar3->type) {
      return;
    }
  }
  pGVar10 = pPVar24->geometryShader;
  if (pGVar10 != (GeometryShader *)0x0) {
    lVar37 = 0;
    while (*(long *)(pGVar10 + 0x28) - *(long *)(pGVar10 + 0x20) >> 3 != lVar37) {
      lVar32 = lVar37 * 8;
      lVar37 = lVar37 + 1;
      if (2 < *(uint *)(*(long *)(pGVar10 + 0x20) + lVar32)) {
        return;
      }
    }
    lVar37 = 0;
    while (*(long *)(pGVar10 + 0x40) - *(long *)(pGVar10 + 0x38) >> 3 != lVar37) {
      lVar32 = lVar37 * 8;
      lVar37 = lVar37 + 1;
      if (2 < *(uint *)(*(long *)(pGVar10 + 0x38) + lVar32)) {
        return;
      }
    }
  }
  if ((ulong)(long)*(int *)&(local_110->m_allocations).
                            super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage < uVar23) {
    return;
  }
  pRVar30 = (RenderTarget *)
            (local_110->m_allocations).
            super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)(long)pRVar30->m_numColorBuffers < uVar26) {
    return;
  }
  lVar37 = -1;
  lVar32 = 0;
  while (lVar37 = lVar37 + 1, lVar37 < pRVar30->m_numColorBuffers) {
    MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              ((MultisampleConstPixelBufferAccess *)&vpalloc_1,
               (MultisamplePixelBufferAccess *)pRVar30);
    emitter.m_emitted.super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              ((MultisampleConstPixelBufferAccess *)&vpalloc,
               (MultisamplePixelBufferAccess *)
               (&((RenderTarget *)
                 (local_110->m_allocations).
                 super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start)->field_0x0 + lVar32));
    primitives.super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    primitives.super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>._M_impl
    .super__Vector_impl_data._M_finish =
         (pointer)vpalloc.m_allocations.
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._4_8_;
    bVar17 = tcu::Vector<int,_4>::operator!=
                       ((Vector<int,_4> *)&emitter,(Vector<int,_4> *)&primitives);
    if (bVar17) {
      return;
    }
    pRVar30 = (RenderTarget *)
              (local_110->m_allocations).
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar5 = (int *)(&pRVar30->field_0x8 + lVar32);
    lVar32 = lVar32 + 0x28;
    if (*(int *)&pRVar30->field_0x8 != *piVar5) {
      return;
    }
  }
  pPVar24 = (Program *)
            (local_110->m_allocations).
            super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pFVar27 = pPVar24->fragmentShader;
  pFVar25 = (pFVar27->m_outputs).
            super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar37 = 0;
  uVar41 = 0;
  while (pVVar34 = local_110,
        uVar41 < (ulong)((long)(pFVar27->m_outputs).
                               super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar25 >> 2)) {
    TVar18 = tcu::getTextureChannelClass
                       (*(ChannelType *)
                         (&((RenderTarget *)
                           (local_110->m_allocations).
                           super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl
                           .super__Vector_impl_data._M_start)->field_0x4 + (lVar37 >> 0x20) * 0x28))
    ;
    GVar29 = (GenericVecType)(TVar18 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER);
    if (TVar18 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      GVar29 = GENERICVECTYPE_INT32;
    }
    pPVar24 = (Program *)
              (local_110->m_allocations).
              super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pFVar27 = pPVar24->fragmentShader;
    pFVar25 = (pFVar27->m_outputs).
              super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar37 = lVar37 + 0x100000000;
    pFVar3 = pFVar25 + uVar41;
    uVar41 = uVar41 + 1;
    if (pFVar3->type != GVar29) {
      return;
    }
  }
  pVVar9 = (pPVar24->vertexShader->m_outputs).
           super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  numberOfVertexOutputs =
       (long)(pPVar24->vertexShader->m_outputs).
             super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)pVVar9 >> 3;
  for (sVar28 = 0; numberOfVertexOutputs != sVar28; sVar28 = sVar28 + 1) {
    if ((pVVar9[sVar28].flatshade == false) && (pVVar9[sVar28].type - GENERICVECTYPE_UINT32 < 2)) {
      return;
    }
  }
  pGVar10 = pPVar24->geometryShader;
  if (pGVar10 == (GeometryShader *)0x0) goto switchD_00542ee4_default;
  lVar37 = *(long *)(pGVar10 + 0x38);
  for (lVar32 = 0; *(long *)(pGVar10 + 0x40) - lVar37 >> 3 != lVar32; lVar32 = lVar32 + 1) {
    if ((*(char *)(lVar37 + 4 + lVar32 * 8) == '\0') && (*(int *)(lVar37 + lVar32 * 8) - 1U < 2)) {
      return;
    }
  }
  switch(*(undefined4 *)(pGVar10 + 8)) {
  case 0:
    if (((PrimitiveList *)
        (local_110->m_singleAllocPool).
        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
        super__Vector_impl_data._M_finish)->m_primitiveType != PRIMITIVETYPE_POINTS) {
      return;
    }
    goto switchD_00542ee4_default;
  case 1:
    PVar20 = ((PrimitiveList *)
             (local_110->m_singleAllocPool).
             super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
             super__Vector_impl_data._M_finish)->m_primitiveType - PRIMITIVETYPE_LINES;
    break;
  case 2:
    uVar19 = ((PrimitiveList *)
             (local_110->m_singleAllocPool).
             super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
             super__Vector_impl_data._M_finish)->m_primitiveType - PRIMITIVETYPE_LINES_ADJACENCY;
    goto joined_r0x00542f01;
  case 3:
    PVar20 = ((PrimitiveList *)
             (local_110->m_singleAllocPool).
             super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
             super__Vector_impl_data._M_finish)->m_primitiveType;
    break;
  case 4:
    uVar19 = ((PrimitiveList *)
             (local_110->m_singleAllocPool).
             super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
             super__Vector_impl_data._M_finish)->m_primitiveType - PRIMITIVETYPE_TRIANGLES_ADJACENCY
    ;
joined_r0x00542f01:
    if (1 < uVar19) {
      return;
    }
  default:
    goto switchD_00542ee4_default;
  }
  if (PRIMITIVETYPE_TRIANGLE_FAN < PVar20) {
    return;
  }
switchD_00542ee4_default:
  if (((PrimitiveList *)
      (local_110->m_singleAllocPool).
      super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
      super__Vector_impl_data._M_finish)->m_numElements == 0) {
    return;
  }
  VertexPacketAllocator::VertexPacketAllocator(&vpalloc,numberOfVertexOutputs);
  VertexPacketAllocator::allocArray
            (&vertexPackets,&vpalloc,
             ((PrimitiveList *)
             (pVVar34->m_singleAllocPool).
             super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
             super__Vector_impl_data._M_finish)->m_numElements);
  iVar22 = 0;
  pVVar34 = local_110;
  do {
    if (iVar22 == numInstances) {
      std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::~_Vector_base
                (&vertexPackets.
                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>);
      VertexPacketAllocator::~VertexPacketAllocator(&vpalloc);
      return;
    }
    local_16c.primitiveID = 0;
    uVar41 = 0;
    while( true ) {
      ppVVar16 = vertexPackets.
                 super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      this_00 = (PrimitiveList *)
                (pVVar34->m_singleAllocPool).
                super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar23 = this_00->m_numElements;
      if (uVar23 <= uVar41) break;
      uVar26 = 0;
      while( true ) {
        uVar19 = (uint)uVar26;
        uVar38 = (ulong)(int)uVar19;
        if ((uVar23 <= uVar41) ||
           ((pRVar11 = (RenderState *)pVVar34->m_numberOfVertexOutputs,
            (pRVar11->restart).enabled == true &&
            (bVar17 = PrimitiveList::isRestartIndex(this_00,uVar41,(pRVar11->restart).restartIndex),
            pVVar34 = local_110, bVar17)))) break;
        pVVar12 = ppVVar16[uVar38];
        pVVar12->instanceNdx = iVar22;
        sVar28 = PrimitiveList::getIndex(this_00,uVar41);
        pVVar12->vertexNdx = (int)sVar28;
        pVVar12->pointSize = (pRVar11->point).pointSize;
        uVar41 = uVar41 + 1;
        (pVVar12->position).m_data[0] = 0.0;
        (pVVar12->position).m_data[1] = 0.0;
        (pVVar12->position).m_data[2] = 0.0;
        (pVVar12->position).m_data[3] = 0.0;
        this_00 = (PrimitiveList *)
                  (local_110->m_singleAllocPool).
                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        uVar23 = this_00->m_numElements;
        uVar26 = (ulong)(uVar19 + 1);
        pVVar34 = local_110;
      }
      if (uVar19 == 0) goto switchD_00543078_default;
      pVVar7 = ((Program *)
               (pVVar34->m_allocations).
               super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish)->vertexShader;
      (**pVVar7->_vptr_VertexShader)
                (pVVar7,(VertexAttrib *)
                        (pVVar34->m_singleAllocPool).
                        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                 vertexPackets.
                 super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl
                 .super__Vector_impl_data._M_start,uVar26);
      ppVVar16 = vertexPackets.
                 super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      switch(((PrimitiveList *)
             (pVVar34->m_singleAllocPool).
             super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
             super__Vector_impl_data._M_finish)->m_primitiveType) {
      case PRIMITIVETYPE_TRIANGLES:
        pRVar11 = (RenderState *)pVVar34->m_numberOfVertexOutputs;
        pRVar30 = (RenderTarget *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar24 = (Program *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::vector
                  ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&inputPrimitives,
                   uVar38 / 3,(allocator_type *)&vpalloc_1);
        pa::Triangles::
        exec<__gnu_cxx::__normal_iterator<rr::pa::Triangle*,std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>>
                  ((__normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
                    )inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_start,ppVVar16,uVar38,
                   pRVar11->provokingVertexConvention);
        pGVar10 = pPVar24->geometryShader;
        if (pGVar10 == (GeometryShader *)0x0) {
          vpalloc_1.m_numberOfVertexOutputs =
               (size_t)inputPrimitives.
                       super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ =
               SUB84(inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_finish,0);
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_start._4_4_ =
               (undefined4)
               ((ulong)inputPrimitives.
                       super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                       ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_finish._0_4_ =
               SUB84(inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_finish._4_4_ =
               (undefined4)
               ((ulong)inputPrimitives.
                       super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
          inputPrimitives.
          super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          inputPrimitives.
          super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          inputPrimitives.
          super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          rr::(anonymous_namespace)::
          makeSharedVerticesDistinct<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                    ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1,
                     &vpalloc);
          rr::(anonymous_namespace)::
          generatePrimitiveIDs<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                    ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1,
                     &local_16c);
          rr::(anonymous_namespace)::
          drawBasicPrimitives<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                    (pRVar11,pRVar30,pPVar24,
                     (vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1,
                     &vpalloc);
          goto LAB_00544da5;
        }
        VertexPacketAllocator::VertexPacketAllocator
                  (&vpalloc_1,*(long *)(pGVar10 + 0x40) - *(long *)(pGVar10 + 0x38) >> 3);
        GeometryEmitter::GeometryEmitter
                  (&emitter,&vpalloc_1,*(size_t *)(pPVar24->geometryShader + 0x10));
        std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                  (&primitives,
                   (long)inputPrimitives.
                         super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)inputPrimitives.
                         super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_128
                  );
        lVar37 = 0x18;
        uVar13 = *(undefined8 *)(pPVar24->geometryShader + 0x18);
        lVar32 = 0x10;
        for (uVar23 = 0;
            uVar23 < (ulong)((long)inputPrimitives.
                                   super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)inputPrimitives.
                                   super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar23 = uVar23 + 1) {
          *(int *)((long)(primitives.
                          super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                          ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -0x20) =
               local_16c.primitiveID + (int)uVar23;
          *(undefined8 *)
           ((long)(primitives.
                   super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                   _M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -0x18) =
               *(undefined8 *)
                ((long)inputPrimitives.
                       super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar32 + -0x10);
          *(undefined8 *)
           ((long)(primitives.
                   super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                   _M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -0x10) =
               *(undefined8 *)
                ((long)inputPrimitives.
                       super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar32 + -8);
          *(undefined8 *)
           ((long)(primitives.
                   super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                   _M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -8) =
               *(undefined8 *)
                ((long)&(inputPrimitives.
                         super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         ._M_impl.super__Vector_impl_data._M_start)->v0 + lVar32);
          lVar32 = lVar32 + 0x20;
          lVar37 = lVar37 + 0x38;
        }
        local_16c.primitiveID = local_16c.primitiveID + (int)uVar23;
        if (primitives.super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            primitives.super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar36 = 0;
          iVar21 = (int)uVar13;
          if (iVar21 < 1) {
            iVar21 = 0;
          }
          for (; iVar36 != iVar21; iVar36 = iVar36 + 1) {
            (*(code *)**(undefined8 **)pPVar24->geometryShader)
                      (pPVar24->geometryShader,&emitter,3,
                       primitives.
                       super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       ((long)primitives.
                              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)primitives.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff,iVar36);
            local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            GeometryEmitter::moveEmittedTo
                      (&emitter,(vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)
                                &local_128);
            uVar23 = 0;
            while (uVar26 = (long)local_128._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_128._M_impl.super__Vector_impl_data._M_start >> 3,
                  uVar23 < uVar26) {
              if (local_128._M_impl.super__Vector_impl_data._M_start[uVar23] == (VertexPacket *)0x0)
              {
                uVar23 = uVar23 + 1;
              }
              else {
                ppVVar4 = local_128._M_impl.super__Vector_impl_data._M_start + uVar23;
                uVar38 = uVar23;
                do {
                  uVar33 = uVar38;
                  uVar38 = uVar33 + 1;
                  uVar35 = uVar26;
                  uVar39 = uVar26 - 1;
                  if (uVar26 <= uVar38) break;
                  uVar35 = uVar38;
                  uVar39 = uVar33;
                } while (local_128._M_impl.super__Vector_impl_data._M_start[uVar33 + 1] !=
                         (VertexPacket *)0x0);
                iVar6 = *(int *)(pPVar24->geometryShader + 0xc);
                if (iVar6 == 0) {
                  anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                            (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                }
                else if (iVar6 == 1) {
                  anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                            (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                }
                else if (iVar6 == 2) {
                  anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                            (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                }
                uVar23 = uVar39 + 2;
              }
            }
            std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
            ~_Vector_base(&local_128);
          }
        }
LAB_0054463d:
        std::_Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::~_Vector_base
                  (&primitives.
                    super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>);
        std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::~_Vector_base
                  ((_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)&emitter
                  );
        VertexPacketAllocator::~VertexPacketAllocator(&vpalloc_1);
        goto LAB_00544dad;
      case PRIMITIVETYPE_TRIANGLE_STRIP:
        pRVar11 = (RenderState *)pVVar34->m_numberOfVertexOutputs;
        pRVar30 = (RenderTarget *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar24 = (Program *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        sVar31 = 0;
        if (2 < uVar19) {
          sVar31 = uVar38 - 2;
        }
        std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::vector
                  ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&inputPrimitives,
                   sVar31,(allocator_type *)&vpalloc_1);
        pa::TriangleStrip::
        exec<__gnu_cxx::__normal_iterator<rr::pa::Triangle*,std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>>
                  ((__normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
                    )inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_start,ppVVar16,uVar38,
                   pRVar11->provokingVertexConvention);
        pGVar10 = pPVar24->geometryShader;
        if (pGVar10 != (GeometryShader *)0x0) {
          VertexPacketAllocator::VertexPacketAllocator
                    (&vpalloc_1,*(long *)(pGVar10 + 0x40) - *(long *)(pGVar10 + 0x38) >> 3);
          GeometryEmitter::GeometryEmitter
                    (&emitter,&vpalloc_1,*(size_t *)(pPVar24->geometryShader + 0x10));
          std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                    (&primitives,
                     (long)inputPrimitives.
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)inputPrimitives.
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5,
                     (allocator_type *)&local_128);
          lVar37 = 0x18;
          uVar13 = *(undefined8 *)(pPVar24->geometryShader + 0x18);
          lVar32 = 0x10;
          for (uVar23 = 0;
              uVar23 < (ulong)((long)inputPrimitives.
                                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)inputPrimitives.
                                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar23 = uVar23 + 1) {
            *(int *)((long)(primitives.
                            super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                            ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -0x20) =
                 local_16c.primitiveID + (int)uVar23;
            *(undefined8 *)
             ((long)(primitives.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -0x18) =
                 *(undefined8 *)
                  ((long)inputPrimitives.
                         super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar32 + -0x10);
            *(undefined8 *)
             ((long)(primitives.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -0x10) =
                 *(undefined8 *)
                  ((long)inputPrimitives.
                         super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar32 + -8);
            *(undefined8 *)
             ((long)(primitives.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -8) =
                 *(undefined8 *)
                  ((long)&(inputPrimitives.
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           ._M_impl.super__Vector_impl_data._M_start)->v0 + lVar32);
            lVar32 = lVar32 + 0x20;
            lVar37 = lVar37 + 0x38;
          }
          local_16c.primitiveID = local_16c.primitiveID + (int)uVar23;
          if (primitives.
              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>._M_impl.
              super__Vector_impl_data._M_start !=
              primitives.
              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            iVar36 = 0;
            iVar21 = (int)uVar13;
            if (iVar21 < 1) {
              iVar21 = 0;
            }
            for (; iVar36 != iVar21; iVar36 = iVar36 + 1) {
              (*(code *)**(undefined8 **)pPVar24->geometryShader)
                        (pPVar24->geometryShader,&emitter,3,
                         primitives.
                         super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         ((long)primitives.
                                super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)primitives.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff,iVar36
                        );
              local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              GeometryEmitter::moveEmittedTo
                        (&emitter,(vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )&local_128);
              uVar23 = 0;
              while (uVar26 = (long)local_128._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_128._M_impl.super__Vector_impl_data._M_start >> 3,
                    uVar23 < uVar26) {
                if (local_128._M_impl.super__Vector_impl_data._M_start[uVar23] ==
                    (VertexPacket *)0x0) {
                  uVar23 = uVar23 + 1;
                }
                else {
                  ppVVar4 = local_128._M_impl.super__Vector_impl_data._M_start + uVar23;
                  uVar38 = uVar23;
                  do {
                    uVar33 = uVar38;
                    uVar38 = uVar33 + 1;
                    uVar35 = uVar26;
                    uVar39 = uVar26 - 1;
                    if (uVar26 <= uVar38) break;
                    uVar35 = uVar38;
                    uVar39 = uVar33;
                  } while (local_128._M_impl.super__Vector_impl_data._M_start[uVar33 + 1] !=
                           (VertexPacket *)0x0);
                  iVar6 = *(int *)(pPVar24->geometryShader + 0xc);
                  if (iVar6 == 2) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  else if (iVar6 == 1) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  else if (iVar6 == 0) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  uVar23 = uVar39 + 2;
                }
              }
              std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
              ~_Vector_base(&local_128);
            }
          }
          goto LAB_0054463d;
        }
        vpalloc_1.m_numberOfVertexOutputs =
             (size_t)inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ =
             SUB84(inputPrimitives.
                   super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                   ._M_impl.super__Vector_impl_data._M_finish,0);
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ =
             (undefined4)
             ((ulong)inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ =
             SUB84(inputPrimitives.
                   super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ =
             (undefined4)
             ((ulong)inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
        inputPrimitives.
        super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        inputPrimitives.
        super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        inputPrimitives.
        super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        rr::(anonymous_namespace)::
        makeSharedVerticesDistinct<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                  ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1,
                   &vpalloc);
        rr::(anonymous_namespace)::
        generatePrimitiveIDs<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                  ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1,
                   &local_16c);
        rr::(anonymous_namespace)::
        drawBasicPrimitives<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                  (pRVar11,pRVar30,pPVar24,
                   (vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1,
                   &vpalloc);
        goto LAB_00544da5;
      case PRIMITIVETYPE_TRIANGLE_FAN:
        pRVar11 = (RenderState *)pVVar34->m_numberOfVertexOutputs;
        pRVar30 = (RenderTarget *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar24 = (Program *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        sVar31 = 0;
        if (2 < uVar19) {
          sVar31 = uVar38 - 2;
        }
        std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::vector
                  ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&inputPrimitives,
                   sVar31,(allocator_type *)&vpalloc_1);
        pa::TriangleFan::
        exec<__gnu_cxx::__normal_iterator<rr::pa::Triangle*,std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>>
                  ((__normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
                    )inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_start,ppVVar16,uVar38,
                   pRVar11->provokingVertexConvention);
        pGVar10 = pPVar24->geometryShader;
        if (pGVar10 != (GeometryShader *)0x0) {
          VertexPacketAllocator::VertexPacketAllocator
                    (&vpalloc_1,*(long *)(pGVar10 + 0x40) - *(long *)(pGVar10 + 0x38) >> 3);
          GeometryEmitter::GeometryEmitter
                    (&emitter,&vpalloc_1,*(size_t *)(pPVar24->geometryShader + 0x10));
          std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                    (&primitives,
                     (long)inputPrimitives.
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)inputPrimitives.
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5,
                     (allocator_type *)&local_128);
          lVar37 = 0x18;
          uVar13 = *(undefined8 *)(pPVar24->geometryShader + 0x18);
          lVar32 = 0x10;
          for (uVar23 = 0;
              uVar23 < (ulong)((long)inputPrimitives.
                                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)inputPrimitives.
                                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar23 = uVar23 + 1) {
            *(int *)((long)(primitives.
                            super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                            ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -0x20) =
                 local_16c.primitiveID + (int)uVar23;
            *(undefined8 *)
             ((long)(primitives.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -0x18) =
                 *(undefined8 *)
                  ((long)inputPrimitives.
                         super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar32 + -0x10);
            *(undefined8 *)
             ((long)(primitives.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -0x10) =
                 *(undefined8 *)
                  ((long)inputPrimitives.
                         super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar32 + -8);
            *(undefined8 *)
             ((long)(primitives.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -8) =
                 *(undefined8 *)
                  ((long)&(inputPrimitives.
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           ._M_impl.super__Vector_impl_data._M_start)->v0 + lVar32);
            lVar32 = lVar32 + 0x20;
            lVar37 = lVar37 + 0x38;
          }
          local_16c.primitiveID = local_16c.primitiveID + (int)uVar23;
          if (primitives.
              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>._M_impl.
              super__Vector_impl_data._M_start !=
              primitives.
              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            iVar36 = 0;
            iVar21 = (int)uVar13;
            if (iVar21 < 1) {
              iVar21 = 0;
            }
            for (; iVar36 != iVar21; iVar36 = iVar36 + 1) {
              (*(code *)**(undefined8 **)pPVar24->geometryShader)
                        (pPVar24->geometryShader,&emitter,3,
                         primitives.
                         super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         ((long)primitives.
                                super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)primitives.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff,iVar36
                        );
              local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              GeometryEmitter::moveEmittedTo
                        (&emitter,(vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )&local_128);
              uVar23 = 0;
              while (uVar26 = (long)local_128._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_128._M_impl.super__Vector_impl_data._M_start >> 3,
                    uVar23 < uVar26) {
                if (local_128._M_impl.super__Vector_impl_data._M_start[uVar23] ==
                    (VertexPacket *)0x0) {
                  uVar23 = uVar23 + 1;
                }
                else {
                  ppVVar4 = local_128._M_impl.super__Vector_impl_data._M_start + uVar23;
                  uVar38 = uVar23;
                  do {
                    uVar33 = uVar38;
                    uVar38 = uVar33 + 1;
                    uVar35 = uVar26;
                    uVar39 = uVar26 - 1;
                    if (uVar26 <= uVar38) break;
                    uVar35 = uVar38;
                    uVar39 = uVar33;
                  } while (local_128._M_impl.super__Vector_impl_data._M_start[uVar33 + 1] !=
                           (VertexPacket *)0x0);
                  iVar6 = *(int *)(pPVar24->geometryShader + 0xc);
                  if (iVar6 == 2) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  else if (iVar6 == 1) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  else if (iVar6 == 0) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  uVar23 = uVar39 + 2;
                }
              }
              std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
              ~_Vector_base(&local_128);
            }
          }
          goto LAB_0054463d;
        }
        vpalloc_1.m_numberOfVertexOutputs =
             (size_t)inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ =
             SUB84(inputPrimitives.
                   super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                   ._M_impl.super__Vector_impl_data._M_finish,0);
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ =
             (undefined4)
             ((ulong)inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ =
             SUB84(inputPrimitives.
                   super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ =
             (undefined4)
             ((ulong)inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
        inputPrimitives.
        super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        inputPrimitives.
        super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        inputPrimitives.
        super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        rr::(anonymous_namespace)::
        makeSharedVerticesDistinct<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                  ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1,
                   &vpalloc);
        rr::(anonymous_namespace)::
        generatePrimitiveIDs<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                  ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1,
                   &local_16c);
        rr::(anonymous_namespace)::
        drawBasicPrimitives<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                  (pRVar11,pRVar30,pPVar24,
                   (vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1,
                   &vpalloc);
LAB_00544da5:
        std::_Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::~_Vector_base
                  ((_Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1);
LAB_00544dad:
        std::_Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::~_Vector_base
                  ((_Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)
                   &inputPrimitives);
        pVVar34 = local_110;
        break;
      case PRIMITIVETYPE_LINES:
        pRVar11 = (RenderState *)pVVar34->m_numberOfVertexOutputs;
        pRVar30 = (RenderTarget *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar24 = (Program *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::vector
                  ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&inputPrimitives,
                   uVar38 >> 1,(allocator_type *)&vpalloc_1);
        pa::Lines::
        exec<__gnu_cxx::__normal_iterator<rr::pa::Line*,std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>>
                  ((__normal_iterator<rr::pa::Line_*,_std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>_>
                    )inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_start,ppVVar16,uVar38,
                   pRVar11->provokingVertexConvention);
        pGVar10 = pPVar24->geometryShader;
        if (pGVar10 == (GeometryShader *)0x0) {
          vpalloc_1.m_numberOfVertexOutputs =
               (size_t)inputPrimitives.
                       super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ =
               SUB84(inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_finish,0);
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_start._4_4_ =
               (undefined4)
               ((ulong)inputPrimitives.
                       super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                       ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_finish._0_4_ =
               SUB84(inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_finish._4_4_ =
               (undefined4)
               ((ulong)inputPrimitives.
                       super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
          inputPrimitives.
          super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          inputPrimitives.
          super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          inputPrimitives.
          super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          rr::(anonymous_namespace)::
          makeSharedVerticesDistinct<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                    ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1,&vpalloc);
          rr::(anonymous_namespace)::
          generatePrimitiveIDs<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                    ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1,&local_16c);
          rr::(anonymous_namespace)::
          drawBasicPrimitives<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                    (pRVar11,pRVar30,pPVar24,
                     (vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1,pVVar34);
          goto LAB_00544e0f;
        }
        VertexPacketAllocator::VertexPacketAllocator
                  (&vpalloc_1,*(long *)(pGVar10 + 0x40) - *(long *)(pGVar10 + 0x38) >> 3);
        GeometryEmitter::GeometryEmitter
                  (&emitter,&vpalloc_1,*(size_t *)(pPVar24->geometryShader + 0x10));
        std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                  (&primitives,
                   ((long)inputPrimitives.
                          super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)inputPrimitives.
                         super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18,
                   (allocator_type *)&local_128);
        uVar13 = *(undefined8 *)(pPVar24->geometryShader + 0x18);
        lVar37 = 0x10;
        lVar32 = 8;
        for (uVar23 = 0;
            uVar23 < (ulong)(((long)inputPrimitives.
                                    super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)inputPrimitives.
                                   super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
            uVar23 = uVar23 + 1) {
          *(int *)((long)(primitives.
                          super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                          ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -0x18) =
               local_16c.primitiveID + (int)uVar23;
          *(undefined8 *)
           ((long)(primitives.
                   super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                   _M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -0x10) =
               *(undefined8 *)
                ((long)inputPrimitives.
                       super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar32 + -8);
          *(undefined8 *)
           ((long)(primitives.
                   super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                   _M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -8) =
               *(undefined8 *)
                ((long)&(inputPrimitives.
                         super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         ._M_impl.super__Vector_impl_data._M_start)->v0 + lVar32);
          lVar32 = lVar32 + 0x18;
          lVar37 = lVar37 + 0x38;
        }
        local_16c.primitiveID = local_16c.primitiveID + (int)uVar23;
        if (primitives.super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            primitives.super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar36 = 0;
          iVar21 = (int)uVar13;
          if (iVar21 < 1) {
            iVar21 = 0;
          }
          for (; iVar36 != iVar21; iVar36 = iVar36 + 1) {
            (*(code *)**(undefined8 **)pPVar24->geometryShader)
                      (pPVar24->geometryShader,&emitter,2,
                       primitives.
                       super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       ((long)primitives.
                              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)primitives.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff,iVar36);
            local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            GeometryEmitter::moveEmittedTo
                      (&emitter,(vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)
                                &local_128);
            uVar23 = 0;
            while (uVar26 = (long)local_128._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_128._M_impl.super__Vector_impl_data._M_start >> 3,
                  uVar23 < uVar26) {
              if (local_128._M_impl.super__Vector_impl_data._M_start[uVar23] == (VertexPacket *)0x0)
              {
                uVar23 = uVar23 + 1;
              }
              else {
                ppVVar4 = local_128._M_impl.super__Vector_impl_data._M_start + uVar23;
                uVar38 = uVar23;
                do {
                  uVar33 = uVar38;
                  uVar38 = uVar33 + 1;
                  uVar35 = uVar26;
                  uVar39 = uVar26 - 1;
                  if (uVar26 <= uVar38) break;
                  uVar35 = uVar38;
                  uVar39 = uVar33;
                } while (local_128._M_impl.super__Vector_impl_data._M_start[uVar33 + 1] !=
                         (VertexPacket *)0x0);
                iVar6 = *(int *)(pPVar24->geometryShader + 0xc);
                if (iVar6 == 2) {
                  anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                            (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                }
                else if (iVar6 == 1) {
                  anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                            (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                }
                else if (iVar6 == 0) {
                  anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                            (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                }
                uVar23 = uVar39 + 2;
              }
            }
            std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
            ~_Vector_base(&local_128);
          }
        }
LAB_005447aa:
        std::_Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::~_Vector_base
                  (&primitives.
                    super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>);
        std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::~_Vector_base
                  ((_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)&emitter
                  );
        VertexPacketAllocator::~VertexPacketAllocator(&vpalloc_1);
        goto LAB_00544e17;
      case PRIMITIVETYPE_LINE_STRIP:
        pRVar11 = (RenderState *)pVVar34->m_numberOfVertexOutputs;
        pRVar30 = (RenderTarget *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar24 = (Program *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::vector
                  ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&inputPrimitives,
                   uVar38 - 1,(allocator_type *)&vpalloc_1);
        pa::LineStrip::
        exec<__gnu_cxx::__normal_iterator<rr::pa::Line*,std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>>
                  ((__normal_iterator<rr::pa::Line_*,_std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>_>
                    )inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_start,ppVVar16,uVar38,
                   pRVar11->provokingVertexConvention);
        pGVar10 = pPVar24->geometryShader;
        if (pGVar10 != (GeometryShader *)0x0) {
          VertexPacketAllocator::VertexPacketAllocator
                    (&vpalloc_1,*(long *)(pGVar10 + 0x40) - *(long *)(pGVar10 + 0x38) >> 3);
          GeometryEmitter::GeometryEmitter
                    (&emitter,&vpalloc_1,*(size_t *)(pPVar24->geometryShader + 0x10));
          std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                    (&primitives,
                     ((long)inputPrimitives.
                            super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)inputPrimitives.
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18,
                     (allocator_type *)&local_128);
          uVar13 = *(undefined8 *)(pPVar24->geometryShader + 0x18);
          lVar37 = 0x10;
          lVar32 = 8;
          for (uVar23 = 0;
              uVar23 < (ulong)(((long)inputPrimitives.
                                      super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)inputPrimitives.
                                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x18);
              uVar23 = uVar23 + 1) {
            *(int *)((long)(primitives.
                            super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                            ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -0x18) =
                 local_16c.primitiveID + (int)uVar23;
            *(undefined8 *)
             ((long)(primitives.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -0x10) =
                 *(undefined8 *)
                  ((long)inputPrimitives.
                         super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar32 + -8);
            *(undefined8 *)
             ((long)(primitives.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -8) =
                 *(undefined8 *)
                  ((long)&(inputPrimitives.
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           ._M_impl.super__Vector_impl_data._M_start)->v0 + lVar32);
            lVar32 = lVar32 + 0x18;
            lVar37 = lVar37 + 0x38;
          }
          local_16c.primitiveID = local_16c.primitiveID + (int)uVar23;
          if (primitives.
              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>._M_impl.
              super__Vector_impl_data._M_start !=
              primitives.
              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            iVar36 = 0;
            iVar21 = (int)uVar13;
            if (iVar21 < 1) {
              iVar21 = 0;
            }
            for (; iVar36 != iVar21; iVar36 = iVar36 + 1) {
              (*(code *)**(undefined8 **)pPVar24->geometryShader)
                        (pPVar24->geometryShader,&emitter,2,
                         primitives.
                         super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         ((long)primitives.
                                super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)primitives.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff,iVar36
                        );
              local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              GeometryEmitter::moveEmittedTo
                        (&emitter,(vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )&local_128);
              uVar23 = 0;
              while (uVar26 = (long)local_128._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_128._M_impl.super__Vector_impl_data._M_start >> 3,
                    uVar23 < uVar26) {
                if (local_128._M_impl.super__Vector_impl_data._M_start[uVar23] ==
                    (VertexPacket *)0x0) {
                  uVar23 = uVar23 + 1;
                }
                else {
                  ppVVar4 = local_128._M_impl.super__Vector_impl_data._M_start + uVar23;
                  uVar38 = uVar23;
                  do {
                    uVar33 = uVar38;
                    uVar38 = uVar33 + 1;
                    uVar35 = uVar26;
                    uVar39 = uVar26 - 1;
                    if (uVar26 <= uVar38) break;
                    uVar35 = uVar38;
                    uVar39 = uVar33;
                  } while (local_128._M_impl.super__Vector_impl_data._M_start[uVar33 + 1] !=
                           (VertexPacket *)0x0);
                  iVar6 = *(int *)(pPVar24->geometryShader + 0xc);
                  if (iVar6 == 2) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  else if (iVar6 == 1) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  else if (iVar6 == 0) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  uVar23 = uVar39 + 2;
                }
              }
              std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
              ~_Vector_base(&local_128);
            }
          }
          goto LAB_005447aa;
        }
        vpalloc_1.m_numberOfVertexOutputs =
             (size_t)inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ =
             SUB84(inputPrimitives.
                   super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                   ._M_impl.super__Vector_impl_data._M_finish,0);
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ =
             (undefined4)
             ((ulong)inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ =
             SUB84(inputPrimitives.
                   super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ =
             (undefined4)
             ((ulong)inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
        inputPrimitives.
        super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        inputPrimitives.
        super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        inputPrimitives.
        super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        rr::(anonymous_namespace)::
        makeSharedVerticesDistinct<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                  ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1,&vpalloc);
        rr::(anonymous_namespace)::
        generatePrimitiveIDs<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                  ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1,&local_16c);
        rr::(anonymous_namespace)::
        drawBasicPrimitives<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                  (pRVar11,pRVar30,pPVar24,
                   (vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1,pVVar34);
        goto LAB_00544e0f;
      case PRIMITIVETYPE_LINE_LOOP:
        pRVar11 = (RenderState *)pVVar34->m_numberOfVertexOutputs;
        pRVar30 = (RenderTarget *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar24 = (Program *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        uVar23 = uVar38;
        if (uVar19 == 1) {
          uVar23 = 0;
        }
        std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::vector
                  ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&inputPrimitives,uVar23,
                   (allocator_type *)&vpalloc_1);
        pa::LineLoop::
        exec<__gnu_cxx::__normal_iterator<rr::pa::Line*,std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>>
                  ((__normal_iterator<rr::pa::Line_*,_std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>_>
                    )inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_start,ppVVar16,uVar38,
                   pRVar11->provokingVertexConvention);
        pGVar10 = pPVar24->geometryShader;
        if (pGVar10 != (GeometryShader *)0x0) {
          VertexPacketAllocator::VertexPacketAllocator
                    (&vpalloc_1,*(long *)(pGVar10 + 0x40) - *(long *)(pGVar10 + 0x38) >> 3);
          GeometryEmitter::GeometryEmitter
                    (&emitter,&vpalloc_1,*(size_t *)(pPVar24->geometryShader + 0x10));
          std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                    (&primitives,
                     ((long)inputPrimitives.
                            super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)inputPrimitives.
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18,
                     (allocator_type *)&local_128);
          uVar13 = *(undefined8 *)(pPVar24->geometryShader + 0x18);
          lVar37 = 0x10;
          lVar32 = 8;
          for (uVar23 = 0;
              uVar23 < (ulong)(((long)inputPrimitives.
                                      super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)inputPrimitives.
                                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x18);
              uVar23 = uVar23 + 1) {
            *(int *)((long)(primitives.
                            super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                            ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -0x18) =
                 local_16c.primitiveID + (int)uVar23;
            *(undefined8 *)
             ((long)(primitives.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -0x10) =
                 *(undefined8 *)
                  ((long)inputPrimitives.
                         super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar32 + -8);
            *(undefined8 *)
             ((long)(primitives.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -8) =
                 *(undefined8 *)
                  ((long)&(inputPrimitives.
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           ._M_impl.super__Vector_impl_data._M_start)->v0 + lVar32);
            lVar32 = lVar32 + 0x18;
            lVar37 = lVar37 + 0x38;
          }
          local_16c.primitiveID = local_16c.primitiveID + (int)uVar23;
          if (primitives.
              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>._M_impl.
              super__Vector_impl_data._M_start !=
              primitives.
              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            iVar36 = 0;
            iVar21 = (int)uVar13;
            if (iVar21 < 1) {
              iVar21 = 0;
            }
            for (; iVar36 != iVar21; iVar36 = iVar36 + 1) {
              (*(code *)**(undefined8 **)pPVar24->geometryShader)
                        (pPVar24->geometryShader,&emitter,2,
                         primitives.
                         super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         ((long)primitives.
                                super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)primitives.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff,iVar36
                        );
              local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              GeometryEmitter::moveEmittedTo
                        (&emitter,(vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )&local_128);
              uVar23 = 0;
              while (uVar26 = (long)local_128._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_128._M_impl.super__Vector_impl_data._M_start >> 3,
                    uVar23 < uVar26) {
                if (local_128._M_impl.super__Vector_impl_data._M_start[uVar23] ==
                    (VertexPacket *)0x0) {
                  uVar23 = uVar23 + 1;
                }
                else {
                  ppVVar4 = local_128._M_impl.super__Vector_impl_data._M_start + uVar23;
                  uVar38 = uVar23;
                  do {
                    uVar33 = uVar38;
                    uVar38 = uVar33 + 1;
                    uVar35 = uVar26;
                    uVar39 = uVar26 - 1;
                    if (uVar26 <= uVar38) break;
                    uVar35 = uVar38;
                    uVar39 = uVar33;
                  } while (local_128._M_impl.super__Vector_impl_data._M_start[uVar33 + 1] !=
                           (VertexPacket *)0x0);
                  iVar6 = *(int *)(pPVar24->geometryShader + 0xc);
                  if (iVar6 == 2) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  else if (iVar6 == 1) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  else if (iVar6 == 0) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  uVar23 = uVar39 + 2;
                }
              }
              std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
              ~_Vector_base(&local_128);
            }
          }
          goto LAB_005447aa;
        }
        vpalloc_1.m_numberOfVertexOutputs =
             (size_t)inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ =
             SUB84(inputPrimitives.
                   super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                   ._M_impl.super__Vector_impl_data._M_finish,0);
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ =
             (undefined4)
             ((ulong)inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ =
             SUB84(inputPrimitives.
                   super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ =
             (undefined4)
             ((ulong)inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
        inputPrimitives.
        super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        inputPrimitives.
        super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        inputPrimitives.
        super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        rr::(anonymous_namespace)::
        makeSharedVerticesDistinct<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                  ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1,&vpalloc);
        rr::(anonymous_namespace)::
        generatePrimitiveIDs<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                  ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1,&local_16c);
        rr::(anonymous_namespace)::
        drawBasicPrimitives<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                  (pRVar11,pRVar30,pPVar24,
                   (vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1,pVVar34);
LAB_00544e0f:
        std::_Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>::~_Vector_base
                  ((_Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1);
LAB_00544e17:
        std::_Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>::~_Vector_base
                  ((_Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&inputPrimitives);
        pVVar34 = local_110;
        break;
      case PRIMITIVETYPE_POINTS:
        pRVar11 = (RenderState *)pVVar34->m_numberOfVertexOutputs;
        pRVar30 = (RenderTarget *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar24 = (Program *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::vector
                  ((vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)&inputPrimitives,uVar38,
                   (allocator_type *)&vpalloc_1);
        pTVar15 = inputPrimitives.
                  super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pTVar40 = inputPrimitives.
                  super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        for (uVar23 = 0; uVar38 != uVar23; uVar23 = uVar23 + 1) {
          (&(inputPrimitives.
             super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
             ._M_impl.super__Vector_impl_data._M_start)->v0)[uVar23] = ppVVar16[uVar23];
        }
        pGVar10 = pPVar24->geometryShader;
        if (pGVar10 == (GeometryShader *)0x0) {
          vpalloc_1.m_numberOfVertexOutputs =
               (size_t)inputPrimitives.
                       super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ =
               SUB84(inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_finish,0);
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_start._4_4_ =
               (undefined4)
               ((ulong)inputPrimitives.
                       super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                       ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_finish._0_4_ =
               SUB84(inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_finish._4_4_ =
               (undefined4)
               ((ulong)inputPrimitives.
                       super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
          inputPrimitives.
          super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          inputPrimitives.
          super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          inputPrimitives.
          super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          rr::(anonymous_namespace)::
          makeSharedVerticesDistinct<std::vector<rr::pa::Point,std::allocator<rr::pa::Point>>>
                    ((vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)&vpalloc_1,&vpalloc);
          for (; pTVar40 != pTVar15; pTVar40 = (pointer)&pTVar40->v1) {
            pTVar40->v0->primitiveID = local_16c.primitiveID;
            local_16c.primitiveID = local_16c.primitiveID + 1;
          }
          rr::(anonymous_namespace)::
          drawBasicPrimitives<std::vector<rr::pa::Point,std::allocator<rr::pa::Point>>>
                    (pRVar11,pRVar30,pPVar24,
                     (vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)&vpalloc_1,pVVar34);
          std::_Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>::~_Vector_base
                    ((_Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)&vpalloc_1);
        }
        else {
          VertexPacketAllocator::VertexPacketAllocator
                    (&vpalloc_1,*(long *)(pGVar10 + 0x40) - *(long *)(pGVar10 + 0x38) >> 3);
          GeometryEmitter::GeometryEmitter
                    (&emitter,&vpalloc_1,*(size_t *)(pPVar24->geometryShader + 0x10));
          std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                    (&primitives,
                     (long)inputPrimitives.
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)inputPrimitives.
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3,
                     (allocator_type *)&local_128);
          uVar13 = *(undefined8 *)(pPVar24->geometryShader + 0x18);
          lVar37 = 1;
          for (uVar23 = 0;
              uVar23 < (ulong)((long)inputPrimitives.
                                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)inputPrimitives.
                                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
              uVar23 = uVar23 + 1) {
            *(int *)((primitives.
                      super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                      _M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -2) =
                 local_16c.primitiveID + (int)uVar23;
            (primitives.
             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>._M_impl.
             super__Vector_impl_data._M_start)->vertices[lVar37 + -1] =
                 (&(inputPrimitives.
                    super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                    ._M_impl.super__Vector_impl_data._M_start)->v0)[uVar23];
            lVar37 = lVar37 + 7;
          }
          local_16c.primitiveID = local_16c.primitiveID + (int)uVar23;
          if (primitives.
              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>._M_impl.
              super__Vector_impl_data._M_start !=
              primitives.
              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            iVar36 = 0;
            iVar21 = (int)uVar13;
            if (iVar21 < 1) {
              iVar21 = 0;
            }
            for (; iVar36 != iVar21; iVar36 = iVar36 + 1) {
              (*(code *)**(undefined8 **)pPVar24->geometryShader)
                        (pPVar24->geometryShader,&emitter,1,
                         primitives.
                         super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         ((long)primitives.
                                super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)primitives.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff,iVar36
                        );
              local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              GeometryEmitter::moveEmittedTo
                        (&emitter,(vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )&local_128);
              uVar23 = 0;
              while (uVar26 = (long)local_128._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_128._M_impl.super__Vector_impl_data._M_start >> 3,
                    uVar23 < uVar26) {
                if (local_128._M_impl.super__Vector_impl_data._M_start[uVar23] ==
                    (VertexPacket *)0x0) {
                  uVar23 = uVar23 + 1;
                }
                else {
                  ppVVar4 = local_128._M_impl.super__Vector_impl_data._M_start + uVar23;
                  uVar38 = uVar23;
                  do {
                    uVar33 = uVar38;
                    uVar38 = uVar33 + 1;
                    uVar35 = uVar26;
                    uVar39 = uVar26 - 1;
                    if (uVar26 <= uVar38) break;
                    uVar35 = uVar38;
                    uVar39 = uVar33;
                  } while (local_128._M_impl.super__Vector_impl_data._M_start[uVar33 + 1] !=
                           (VertexPacket *)0x0);
                  iVar6 = *(int *)(pPVar24->geometryShader + 0xc);
                  if (iVar6 == 2) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  else if (iVar6 == 1) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  else if (iVar6 == 0) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  uVar23 = uVar39 + 2;
                }
              }
              std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
              ~_Vector_base(&local_128);
            }
          }
          std::_Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::
          ~_Vector_base(&primitives.
                         super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                       );
          std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::~_Vector_base
                    ((_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)
                     &emitter);
          VertexPacketAllocator::~VertexPacketAllocator(&vpalloc_1);
        }
        std::_Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>::~_Vector_base
                  ((_Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)&inputPrimitives);
        pVVar34 = local_110;
        break;
      case PRIMITIVETYPE_LINES_ADJACENCY:
        pRVar11 = (RenderState *)pVVar34->m_numberOfVertexOutputs;
        pRVar30 = (RenderTarget *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar24 = (Program *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        std::vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>::vector
                  ((vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *)
                   &inputPrimitives,uVar38 >> 2,(allocator_type *)&vpalloc_1);
        pa::LinesAdjacency::
        exec<__gnu_cxx::__normal_iterator<rr::pa::LineAdjacency*,std::vector<rr::pa::LineAdjacency,std::allocator<rr::pa::LineAdjacency>>>>
                  ((__normal_iterator<rr::pa::LineAdjacency_*,_std::vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>_>
                    )inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_start,ppVVar16,uVar38,
                   pRVar11->provokingVertexConvention);
        pGVar10 = pPVar24->geometryShader;
        if (pGVar10 == (GeometryShader *)0x0) {
          vpalloc_1.m_numberOfVertexOutputs = 0;
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
          anon_unknown_19::convertPrimitiveToBaseType
                    ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1,
                     (vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *)
                     &inputPrimitives);
          rr::(anonymous_namespace)::
          makeSharedVerticesDistinct<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                    ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1,&vpalloc);
          rr::(anonymous_namespace)::
          generatePrimitiveIDs<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                    ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1,&local_16c);
          rr::(anonymous_namespace)::
          drawBasicPrimitives<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                    (pRVar11,pRVar30,pPVar24,
                     (vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1,pVVar34);
          goto LAB_00544f0b;
        }
        VertexPacketAllocator::VertexPacketAllocator
                  (&vpalloc_1,*(long *)(pGVar10 + 0x40) - *(long *)(pGVar10 + 0x38) >> 3);
        GeometryEmitter::GeometryEmitter
                  (&emitter,&vpalloc_1,*(size_t *)(pPVar24->geometryShader + 0x10));
        std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                  (&primitives,
                   ((long)inputPrimitives.
                          super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)inputPrimitives.
                         super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x28,
                   (allocator_type *)&local_128);
        lVar37 = 0x18;
        uVar13 = *(undefined8 *)(pPVar24->geometryShader + 0x18);
        lVar32 = 0x20;
        for (uVar23 = 0;
            uVar23 < (ulong)(((long)inputPrimitives.
                                    super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)inputPrimitives.
                                   super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x28);
            uVar23 = uVar23 + 1) {
          *(int *)((long)(primitives.
                          super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                          ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar32 + -0x28) =
               local_16c.primitiveID + (int)uVar23;
          *(undefined8 *)
           ((long)(primitives.
                   super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                   _M_impl.super__Vector_impl_data._M_start)->vertices + lVar32 + -0x20) =
               *(undefined8 *)
                ((long)inputPrimitives.
                       super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar37 + -0x18);
          *(undefined8 *)
           ((long)(primitives.
                   super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                   _M_impl.super__Vector_impl_data._M_start)->vertices + lVar32 + -0x18) =
               *(undefined8 *)
                ((long)inputPrimitives.
                       super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar37 + -0x10);
          *(undefined8 *)
           ((long)(primitives.
                   super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                   _M_impl.super__Vector_impl_data._M_start)->vertices + lVar32 + -0x10) =
               *(undefined8 *)
                ((long)inputPrimitives.
                       super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar37 + -8);
          *(undefined8 *)
           ((long)(primitives.
                   super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                   _M_impl.super__Vector_impl_data._M_start)->vertices + lVar32 + -8) =
               *(undefined8 *)
                ((long)&(inputPrimitives.
                         super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         ._M_impl.super__Vector_impl_data._M_start)->v0 + lVar37);
          lVar37 = lVar37 + 0x28;
          lVar32 = lVar32 + 0x38;
        }
        local_16c.primitiveID = local_16c.primitiveID + (int)uVar23;
        if (primitives.super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            primitives.super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar36 = 0;
          iVar21 = (int)uVar13;
          if (iVar21 < 1) {
            iVar21 = 0;
          }
          for (; iVar36 != iVar21; iVar36 = iVar36 + 1) {
            (*(code *)**(undefined8 **)pPVar24->geometryShader)
                      (pPVar24->geometryShader,&emitter,4,
                       primitives.
                       super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       ((long)primitives.
                              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)primitives.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff,iVar36);
            local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            GeometryEmitter::moveEmittedTo
                      (&emitter,(vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)
                                &local_128);
            uVar23 = 0;
            while (uVar26 = (long)local_128._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_128._M_impl.super__Vector_impl_data._M_start >> 3,
                  uVar23 < uVar26) {
              if (local_128._M_impl.super__Vector_impl_data._M_start[uVar23] == (VertexPacket *)0x0)
              {
                uVar23 = uVar23 + 1;
              }
              else {
                ppVVar4 = local_128._M_impl.super__Vector_impl_data._M_start + uVar23;
                uVar38 = uVar23;
                do {
                  uVar33 = uVar38;
                  uVar38 = uVar33 + 1;
                  uVar35 = uVar26;
                  uVar39 = uVar26 - 1;
                  if (uVar26 <= uVar38) break;
                  uVar35 = uVar38;
                  uVar39 = uVar33;
                } while (local_128._M_impl.super__Vector_impl_data._M_start[uVar33 + 1] !=
                         (VertexPacket *)0x0);
                iVar6 = *(int *)(pPVar24->geometryShader + 0xc);
                if (iVar6 == 2) {
                  anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                            (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                }
                else if (iVar6 == 1) {
                  anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                            (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                }
                else if (iVar6 == 0) {
                  anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                            (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                }
                uVar23 = uVar39 + 2;
              }
            }
            std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
            ~_Vector_base(&local_128);
          }
        }
LAB_00544a99:
        std::_Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::~_Vector_base
                  (&primitives.
                    super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>);
        std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::~_Vector_base
                  ((_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)&emitter
                  );
        VertexPacketAllocator::~VertexPacketAllocator(&vpalloc_1);
        goto LAB_00544f13;
      case PRIMITIVETYPE_LINE_STRIP_ADJACENCY:
        pRVar11 = (RenderState *)pVVar34->m_numberOfVertexOutputs;
        pRVar30 = (RenderTarget *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar24 = (Program *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        sVar31 = 0;
        if (3 < uVar19) {
          sVar31 = uVar38 - 3;
        }
        std::vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>::vector
                  ((vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *)
                   &inputPrimitives,sVar31,(allocator_type *)&vpalloc_1);
        pa::LineStripAdjacency::
        exec<__gnu_cxx::__normal_iterator<rr::pa::LineAdjacency*,std::vector<rr::pa::LineAdjacency,std::allocator<rr::pa::LineAdjacency>>>>
                  ((__normal_iterator<rr::pa::LineAdjacency_*,_std::vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>_>
                    )inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_start,ppVVar16,uVar38,
                   pRVar11->provokingVertexConvention);
        pGVar10 = pPVar24->geometryShader;
        if (pGVar10 != (GeometryShader *)0x0) {
          VertexPacketAllocator::VertexPacketAllocator
                    (&vpalloc_1,*(long *)(pGVar10 + 0x40) - *(long *)(pGVar10 + 0x38) >> 3);
          GeometryEmitter::GeometryEmitter
                    (&emitter,&vpalloc_1,*(size_t *)(pPVar24->geometryShader + 0x10));
          std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                    (&primitives,
                     ((long)inputPrimitives.
                            super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)inputPrimitives.
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x28,
                     (allocator_type *)&local_128);
          lVar37 = 0x18;
          uVar13 = *(undefined8 *)(pPVar24->geometryShader + 0x18);
          lVar32 = 0x20;
          for (uVar23 = 0;
              uVar23 < (ulong)(((long)inputPrimitives.
                                      super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)inputPrimitives.
                                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x28);
              uVar23 = uVar23 + 1) {
            *(int *)((long)(primitives.
                            super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                            ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar32 + -0x28) =
                 local_16c.primitiveID + (int)uVar23;
            *(undefined8 *)
             ((long)(primitives.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start)->vertices + lVar32 + -0x20) =
                 *(undefined8 *)
                  ((long)inputPrimitives.
                         super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar37 + -0x18);
            *(undefined8 *)
             ((long)(primitives.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start)->vertices + lVar32 + -0x18) =
                 *(undefined8 *)
                  ((long)inputPrimitives.
                         super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar37 + -0x10);
            *(undefined8 *)
             ((long)(primitives.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start)->vertices + lVar32 + -0x10) =
                 *(undefined8 *)
                  ((long)inputPrimitives.
                         super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar37 + -8);
            *(undefined8 *)
             ((long)(primitives.
                     super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>.
                     _M_impl.super__Vector_impl_data._M_start)->vertices + lVar32 + -8) =
                 *(undefined8 *)
                  ((long)&(inputPrimitives.
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           ._M_impl.super__Vector_impl_data._M_start)->v0 + lVar37);
            lVar37 = lVar37 + 0x28;
            lVar32 = lVar32 + 0x38;
          }
          local_16c.primitiveID = local_16c.primitiveID + (int)uVar23;
          if (primitives.
              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>._M_impl.
              super__Vector_impl_data._M_start !=
              primitives.
              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            iVar36 = 0;
            iVar21 = (int)uVar13;
            if (iVar21 < 1) {
              iVar21 = 0;
            }
            for (; iVar36 != iVar21; iVar36 = iVar36 + 1) {
              (*(code *)**(undefined8 **)pPVar24->geometryShader)
                        (pPVar24->geometryShader,&emitter,4,
                         primitives.
                         super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         ((long)primitives.
                                super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)primitives.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff,iVar36
                        );
              local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              GeometryEmitter::moveEmittedTo
                        (&emitter,(vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )&local_128);
              uVar23 = 0;
              while (uVar26 = (long)local_128._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_128._M_impl.super__Vector_impl_data._M_start >> 3,
                    uVar23 < uVar26) {
                if (local_128._M_impl.super__Vector_impl_data._M_start[uVar23] ==
                    (VertexPacket *)0x0) {
                  uVar23 = uVar23 + 1;
                }
                else {
                  ppVVar4 = local_128._M_impl.super__Vector_impl_data._M_start + uVar23;
                  uVar38 = uVar23;
                  do {
                    uVar33 = uVar38;
                    uVar38 = uVar33 + 1;
                    uVar35 = uVar26;
                    uVar39 = uVar26 - 1;
                    if (uVar26 <= uVar38) break;
                    uVar35 = uVar38;
                    uVar39 = uVar33;
                  } while (local_128._M_impl.super__Vector_impl_data._M_start[uVar33 + 1] !=
                           (VertexPacket *)0x0);
                  iVar6 = *(int *)(pPVar24->geometryShader + 0xc);
                  if (iVar6 == 2) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  else if (iVar6 == 1) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  else if (iVar6 == 0) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  uVar23 = uVar39 + 2;
                }
              }
              std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
              ~_Vector_base(&local_128);
            }
          }
          goto LAB_00544a99;
        }
        vpalloc_1.m_numberOfVertexOutputs = 0;
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
        anon_unknown_19::convertPrimitiveToBaseType
                  ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1,
                   (vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *)
                   &inputPrimitives);
        rr::(anonymous_namespace)::
        makeSharedVerticesDistinct<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                  ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1,&vpalloc);
        rr::(anonymous_namespace)::
        generatePrimitiveIDs<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                  ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1,&local_16c);
        rr::(anonymous_namespace)::
        drawBasicPrimitives<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
                  (pRVar11,pRVar30,pPVar24,
                   (vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1,pVVar34);
LAB_00544f0b:
        std::_Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>::~_Vector_base
                  ((_Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)&vpalloc_1);
LAB_00544f13:
        std::_Vector_base<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>::
        ~_Vector_base((_Vector_base<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *
                      )&inputPrimitives);
        pVVar34 = local_110;
        break;
      case PRIMITIVETYPE_TRIANGLES_ADJACENCY:
        pRVar11 = (RenderState *)pVVar34->m_numberOfVertexOutputs;
        pRVar30 = (RenderTarget *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar24 = (Program *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>::vector
                  (&inputPrimitives,uVar38 / 6,(allocator_type *)&vpalloc_1);
        pa::TrianglesAdjacency::
        exec<__gnu_cxx::__normal_iterator<rr::pa::TriangleAdjacency*,std::vector<rr::pa::TriangleAdjacency,std::allocator<rr::pa::TriangleAdjacency>>>>
                  ((__normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                    )inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_start,ppVVar16,uVar38,
                   pRVar11->provokingVertexConvention);
        pGVar10 = pPVar24->geometryShader;
        if (pGVar10 == (GeometryShader *)0x0) {
          vpalloc_1.m_numberOfVertexOutputs = 0;
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
          vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
          _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
          anon_unknown_19::convertPrimitiveToBaseType
                    ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1,
                     &inputPrimitives);
          rr::(anonymous_namespace)::
          makeSharedVerticesDistinct<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                    ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1,
                     &vpalloc);
          rr::(anonymous_namespace)::
          generatePrimitiveIDs<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                    ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1,
                     &local_16c);
          rr::(anonymous_namespace)::
          drawBasicPrimitives<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                    (pRVar11,pRVar30,pPVar24,
                     (vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1,
                     &vpalloc);
          goto LAB_00544eab;
        }
        VertexPacketAllocator::VertexPacketAllocator
                  (&vpalloc_1,*(long *)(pGVar10 + 0x40) - *(long *)(pGVar10 + 0x38) >> 3);
        GeometryEmitter::GeometryEmitter
                  (&emitter,&vpalloc_1,*(size_t *)(pPVar24->geometryShader + 0x10));
        std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                  (&primitives,
                   ((long)inputPrimitives.
                          super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)inputPrimitives.
                         super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x38,
                   (allocator_type *)&local_128);
        DVar14.primitiveID = local_16c.primitiveID;
        uVar13 = *(undefined8 *)(pPVar24->geometryShader + 0x18);
        lVar37 = 0;
        for (uVar23 = 0;
            uVar23 < (ulong)(((long)inputPrimitives.
                                    super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)inputPrimitives.
                                   super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x38);
            uVar23 = uVar23 + 1) {
          piVar5 = (int *)((long)(primitives.
                                  super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->vertices + lVar37 + -8
                          );
          *piVar5 = DVar14.primitiveID + (int)uVar23;
          anon_unknown_19::copyVertexPacketPointers
                    ((VertexPacket **)(piVar5 + 2),
                     (TriangleAdjacency *)
                     ((long)&(inputPrimitives.
                              super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                              ._M_impl.super__Vector_impl_data._M_start)->v0 + lVar37));
          lVar37 = lVar37 + 0x38;
        }
        local_16c.primitiveID = DVar14.primitiveID + (int)uVar23;
        if (primitives.super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            primitives.super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar36 = 0;
          iVar21 = (int)uVar13;
          if (iVar21 < 1) {
            iVar21 = 0;
          }
          for (; iVar36 != iVar21; iVar36 = iVar36 + 1) {
            (*(code *)**(undefined8 **)pPVar24->geometryShader)
                      (pPVar24->geometryShader,&emitter,6,
                       primitives.
                       super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       ((long)primitives.
                              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)primitives.
                             super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff,iVar36);
            local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            GeometryEmitter::moveEmittedTo
                      (&emitter,(vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)
                                &local_128);
            uVar23 = 0;
            while (uVar26 = (long)local_128._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_128._M_impl.super__Vector_impl_data._M_start >> 3,
                  uVar23 < uVar26) {
              if (local_128._M_impl.super__Vector_impl_data._M_start[uVar23] == (VertexPacket *)0x0)
              {
                uVar23 = uVar23 + 1;
              }
              else {
                ppVVar4 = local_128._M_impl.super__Vector_impl_data._M_start + uVar23;
                uVar38 = uVar23;
                do {
                  uVar33 = uVar38;
                  uVar38 = uVar33 + 1;
                  uVar35 = uVar26;
                  uVar39 = uVar26 - 1;
                  if (uVar26 <= uVar38) break;
                  uVar35 = uVar38;
                  uVar39 = uVar33;
                } while (local_128._M_impl.super__Vector_impl_data._M_start[uVar33 + 1] !=
                         (VertexPacket *)0x0);
                iVar6 = *(int *)(pPVar24->geometryShader + 0xc);
                if (iVar6 == 2) {
                  anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                            (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                }
                else if (iVar6 == 1) {
                  anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                            (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                }
                else if (iVar6 == 0) {
                  anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                            (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                }
                uVar23 = uVar39 + 2;
              }
            }
            std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
            ~_Vector_base(&local_128);
          }
        }
LAB_0054492a:
        std::_Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::~_Vector_base
                  (&primitives.
                    super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>);
        std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::~_Vector_base
                  ((_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)&emitter
                  );
        VertexPacketAllocator::~VertexPacketAllocator(&vpalloc_1);
        goto LAB_00544eb3;
      case PRIMITIVETYPE_TRIANGLE_STRIP_ADJACENCY:
        pRVar11 = (RenderState *)pVVar34->m_numberOfVertexOutputs;
        pRVar30 = (RenderTarget *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar24 = (Program *)
                  (pVVar34->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        sVar31 = 0;
        if (5 < uVar19) {
          sVar31 = uVar38 - 4 >> 1;
        }
        std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>::vector
                  (&inputPrimitives,sVar31,(allocator_type *)&vpalloc_1);
        pa::TriangleStripAdjacency::
        exec<__gnu_cxx::__normal_iterator<rr::pa::TriangleAdjacency*,std::vector<rr::pa::TriangleAdjacency,std::allocator<rr::pa::TriangleAdjacency>>>>
                  ((__normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                    )inputPrimitives.
                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     ._M_impl.super__Vector_impl_data._M_start,ppVVar16,uVar38,
                   pRVar11->provokingVertexConvention);
        pGVar10 = pPVar24->geometryShader;
        if (pGVar10 != (GeometryShader *)0x0) {
          VertexPacketAllocator::VertexPacketAllocator
                    (&vpalloc_1,*(long *)(pGVar10 + 0x40) - *(long *)(pGVar10 + 0x38) >> 3);
          GeometryEmitter::GeometryEmitter
                    (&emitter,&vpalloc_1,*(size_t *)(pPVar24->geometryShader + 0x10));
          std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
                    (&primitives,
                     ((long)inputPrimitives.
                            super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)inputPrimitives.
                           super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x38,
                     (allocator_type *)&local_128);
          DVar14.primitiveID = local_16c.primitiveID;
          uVar13 = *(undefined8 *)(pPVar24->geometryShader + 0x18);
          lVar37 = 0;
          for (uVar23 = 0;
              uVar23 < (ulong)(((long)inputPrimitives.
                                      super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)inputPrimitives.
                                     super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x38);
              uVar23 = uVar23 + 1) {
            piVar5 = (int *)((long)(primitives.
                                    super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->vertices +
                            lVar37 + -8);
            *piVar5 = DVar14.primitiveID + (int)uVar23;
            anon_unknown_19::copyVertexPacketPointers
                      ((VertexPacket **)(piVar5 + 2),
                       (TriangleAdjacency *)
                       ((long)&(inputPrimitives.
                                super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                                ._M_impl.super__Vector_impl_data._M_start)->v0 + lVar37));
            lVar37 = lVar37 + 0x38;
          }
          local_16c.primitiveID = DVar14.primitiveID + (int)uVar23;
          if (primitives.
              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>._M_impl.
              super__Vector_impl_data._M_start !=
              primitives.
              super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            iVar36 = 0;
            iVar21 = (int)uVar13;
            if (iVar21 < 1) {
              iVar21 = 0;
            }
            for (; iVar36 != iVar21; iVar36 = iVar36 + 1) {
              (*(code *)**(undefined8 **)pPVar24->geometryShader)
                        (pPVar24->geometryShader,&emitter,6,
                         primitives.
                         super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         ((long)primitives.
                                super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)primitives.
                               super__Vector_base<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x38 & 0xffffffff,iVar36
                        );
              local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              GeometryEmitter::moveEmittedTo
                        (&emitter,(vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )&local_128);
              uVar23 = 0;
              while (uVar26 = (long)local_128._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_128._M_impl.super__Vector_impl_data._M_start >> 3,
                    uVar23 < uVar26) {
                if (local_128._M_impl.super__Vector_impl_data._M_start[uVar23] ==
                    (VertexPacket *)0x0) {
                  uVar23 = uVar23 + 1;
                }
                else {
                  ppVVar4 = local_128._M_impl.super__Vector_impl_data._M_start + uVar23;
                  uVar38 = uVar23;
                  do {
                    uVar33 = uVar38;
                    uVar38 = uVar33 + 1;
                    uVar35 = uVar26;
                    uVar39 = uVar26 - 1;
                    if (uVar26 <= uVar38) break;
                    uVar35 = uVar38;
                    uVar39 = uVar33;
                  } while (local_128._M_impl.super__Vector_impl_data._M_start[uVar33 + 1] !=
                           (VertexPacket *)0x0);
                  iVar6 = *(int *)(pPVar24->geometryShader + 0xc);
                  if (iVar6 == 2) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  else if (iVar6 == 1) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  else if (iVar6 == 0) {
                    anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                              (pRVar11,pRVar30,pPVar24,ppVVar4,uVar35 - uVar23,&vpalloc_1);
                  }
                  uVar23 = uVar39 + 2;
                }
              }
              std::_Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
              ~_Vector_base(&local_128);
            }
          }
          goto LAB_0054492a;
        }
        vpalloc_1.m_numberOfVertexOutputs = 0;
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
        vpalloc_1.m_allocations.super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
        anon_unknown_19::convertPrimitiveToBaseType
                  ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1,
                   &inputPrimitives);
        rr::(anonymous_namespace)::
        makeSharedVerticesDistinct<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                  ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1,
                   &vpalloc);
        rr::(anonymous_namespace)::
        generatePrimitiveIDs<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                  ((vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1,
                   &local_16c);
        rr::(anonymous_namespace)::
        drawBasicPrimitives<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
                  (pRVar11,pRVar30,pPVar24,
                   (vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1,
                   &vpalloc);
LAB_00544eab:
        std::_Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>::~_Vector_base
                  ((_Vector_base<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *)&vpalloc_1);
LAB_00544eb3:
        std::_Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>::
        ~_Vector_base(&inputPrimitives.
                       super__Vector_base<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>
                     );
        pVVar34 = local_110;
      }
switchD_00543078_default:
      uVar41 = uVar41 + 1;
    }
    iVar22 = iVar22 + 1;
  } while( true );
}

Assistant:

void Renderer::drawInstanced (const DrawCommand& command, int numInstances) const
{
	// Do not run bad commands
	{
		const bool validCommand = isValidCommand(command, numInstances);
		if (!validCommand)
		{
			DE_ASSERT(false);
			return;
		}
	}

	// Do not draw if nothing to draw
	{
		if (command.primitives.getNumElements() == 0 || numInstances == 0)
			return;
	}

	// Prepare transformation

	const size_t				numVaryings = command.program.vertexShader->getOutputs().size();
	VertexPacketAllocator		vpalloc(numVaryings);
	std::vector<VertexPacket*>	vertexPackets = vpalloc.allocArray(command.primitives.getNumElements());
	DrawContext					drawContext;

	for (int instanceID = 0; instanceID < numInstances; ++instanceID)
	{
		// Each instance has its own primitives
		drawContext.primitiveID = 0;

		for (size_t elementNdx = 0; elementNdx < command.primitives.getNumElements(); ++elementNdx)
		{
			int numVertexPackets = 0;

			// collect primitive vertices until restart

			while (elementNdx < command.primitives.getNumElements() &&
					!(command.state.restart.enabled && command.primitives.isRestartIndex(elementNdx, command.state.restart.restartIndex)))
			{
				// input
				vertexPackets[numVertexPackets]->instanceNdx	= instanceID;
				vertexPackets[numVertexPackets]->vertexNdx		= (int)command.primitives.getIndex(elementNdx);

				// output
				vertexPackets[numVertexPackets]->pointSize		= command.state.point.pointSize;	// default value from the current state
				vertexPackets[numVertexPackets]->position		= tcu::Vec4(0, 0, 0, 0);			// no undefined values

				++numVertexPackets;
				++elementNdx;
			}

			// Duplicated restart shade
			if (numVertexPackets == 0)
				continue;

			// \todo Vertex cache?

			// Transform vertices

			command.program.vertexShader->shadeVertices(command.vertexAttribs, &vertexPackets[0], numVertexPackets);

			// Draw primitives

			switch (command.primitives.getPrimitiveType())
			{
				case PRIMITIVETYPE_TRIANGLES:				{ drawAsPrimitives<PRIMITIVETYPE_TRIANGLES>					(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_TRIANGLE_STRIP:			{ drawAsPrimitives<PRIMITIVETYPE_TRIANGLE_STRIP>			(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_TRIANGLE_FAN:			{ drawAsPrimitives<PRIMITIVETYPE_TRIANGLE_FAN>				(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_LINES:					{ drawAsPrimitives<PRIMITIVETYPE_LINES>						(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_LINE_STRIP:				{ drawAsPrimitives<PRIMITIVETYPE_LINE_STRIP>				(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_LINE_LOOP:				{ drawAsPrimitives<PRIMITIVETYPE_LINE_LOOP>					(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_POINTS:					{ drawAsPrimitives<PRIMITIVETYPE_POINTS>					(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_LINES_ADJACENCY:			{ drawAsPrimitives<PRIMITIVETYPE_LINES_ADJACENCY>			(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_LINE_STRIP_ADJACENCY:	{ drawAsPrimitives<PRIMITIVETYPE_LINE_STRIP_ADJACENCY>		(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_TRIANGLES_ADJACENCY:		{ drawAsPrimitives<PRIMITIVETYPE_TRIANGLES_ADJACENCY>		(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				case PRIMITIVETYPE_TRIANGLE_STRIP_ADJACENCY:{ drawAsPrimitives<PRIMITIVETYPE_TRIANGLE_STRIP_ADJACENCY>	(command.state, command.renderTarget, command.program, &vertexPackets[0], numVertexPackets, drawContext, vpalloc);	break; }
				default:
					DE_ASSERT(DE_FALSE);
			}
		}
	}
}